

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_font * nk_font_atlas_add(nk_font_atlas *atlas,nk_font_config *config)

{
  nk_plugin_alloc p_Var1;
  nk_font_config *pnVar2;
  nk_font_config *dst0;
  nk_font *__s;
  ulong uVar3;
  void *dst0_00;
  nk_font_config *pnVar4;
  nk_font *pnVar5;
  nk_font *pnVar6;
  ulong uVar7;
  
  if (atlas == (nk_font_atlas *)0x0) {
    __assert_fail("atlas",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x3462,
                  "struct nk_font *nk_font_atlas_add(struct nk_font_atlas *, const struct nk_font_config *)"
                 );
  }
  p_Var1 = (atlas->permanent).alloc;
  if (p_Var1 == (nk_plugin_alloc)0x0) {
    __assert_fail("atlas->permanent.alloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x3463,
                  "struct nk_font *nk_font_atlas_add(struct nk_font_atlas *, const struct nk_font_config *)"
                 );
  }
  if ((atlas->permanent).free == (nk_plugin_free)0x0) {
    __assert_fail("atlas->permanent.free",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x3464,
                  "struct nk_font *nk_font_atlas_add(struct nk_font_atlas *, const struct nk_font_config *)"
                 );
  }
  if ((atlas->temporary).alloc == (nk_plugin_alloc)0x0) {
    __assert_fail("atlas->temporary.alloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x3465,
                  "struct nk_font *nk_font_atlas_add(struct nk_font_atlas *, const struct nk_font_config *)"
                 );
  }
  if ((atlas->temporary).free == (nk_plugin_free)0x0) {
    __assert_fail("atlas->temporary.free",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x3466,
                  "struct nk_font *nk_font_atlas_add(struct nk_font_atlas *, const struct nk_font_config *)"
                 );
  }
  if (config == (nk_font_config *)0x0) {
    __assert_fail("config",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x3468,
                  "struct nk_font *nk_font_atlas_add(struct nk_font_atlas *, const struct nk_font_config *)"
                 );
  }
  if (config->ttf_blob == (void *)0x0) {
    __assert_fail("config->ttf_blob",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x3469,
                  "struct nk_font *nk_font_atlas_add(struct nk_font_atlas *, const struct nk_font_config *)"
                 );
  }
  if (config->ttf_size == 0) {
    __assert_fail("config->ttf_size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x346a,
                  "struct nk_font *nk_font_atlas_add(struct nk_font_atlas *, const struct nk_font_config *)"
                 );
  }
  if (config->size <= 0.0) {
    __assert_fail("config->size > 0.0f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x346b,
                  "struct nk_font *nk_font_atlas_add(struct nk_font_atlas *, const struct nk_font_config *)"
                 );
  }
  dst0 = (nk_font_config *)(*p_Var1)((atlas->permanent).userdata,(void *)0x0,0x58);
  nk_memcopy(dst0,config,0x58);
  dst0->n = dst0;
  dst0->p = dst0;
  if (config->merge_mode == '\0') {
    pnVar2 = atlas->config;
    if (atlas->config == (nk_font_config *)0x0) {
      pnVar4 = (nk_font_config *)&atlas->config;
    }
    else {
      do {
        pnVar4 = pnVar2;
        pnVar2 = pnVar4->next;
      } while (pnVar4->next != (nk_font_config *)0x0);
    }
    pnVar4->next = dst0;
    dst0->next = (nk_font_config *)0x0;
    __s = (nk_font *)(*(atlas->permanent).alloc)((atlas->permanent).userdata,(void *)0x0,0x80);
    if (__s == (nk_font *)0x0) {
      __assert_fail("font",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                    ,0x3487,
                    "struct nk_font *nk_font_atlas_add(struct nk_font_atlas *, const struct nk_font_config *)"
                   );
    }
    uVar7 = (ulong)__s & 3;
    uVar3 = 0x80;
    pnVar6 = __s;
    if (uVar7 != 0) {
      memset(__s,0,4 - uVar7);
      uVar3 = uVar7 | 0x7c;
      pnVar6 = (nk_font *)((4 - uVar7) + (long)__s);
    }
    uVar7 = (ulong)((uint)uVar3 & 0xfffffffc);
    memset(pnVar6,0,uVar7);
    if ((uVar3 & 3) != 0) {
      memset((void *)((long)&pnVar6->next + uVar7),0,uVar3 & 3);
    }
    __s->config = dst0;
    pnVar6 = atlas->fonts;
    if (atlas->fonts == (nk_font *)0x0) {
      pnVar5 = (nk_font *)&atlas->fonts;
    }
    else {
      do {
        pnVar5 = pnVar6;
        pnVar6 = pnVar5->next;
      } while (pnVar5->next != (nk_font *)0x0);
    }
    pnVar5->next = __s;
    __s->next = (nk_font *)0x0;
    dst0->font = &__s->info;
  }
  else {
    if (atlas->font_num == 0) {
      __assert_fail("atlas->font_num",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                    ,0x349b,
                    "struct nk_font *nk_font_atlas_add(struct nk_font_atlas *, const struct nk_font_config *)"
                   );
    }
    pnVar2 = atlas->fonts->config;
    dst0->font = &atlas->fonts->info;
    dst0->n = pnVar2;
    dst0->p = pnVar2->p;
    pnVar2->p->n = dst0;
    pnVar2->p = dst0;
    __s = (nk_font *)0x0;
  }
  if (config->ttf_data_owned_by_atlas == '\0') {
    dst0_00 = (*(atlas->permanent).alloc)((atlas->permanent).userdata,(void *)0x0,dst0->ttf_size);
    dst0->ttf_blob = dst0_00;
    if (dst0_00 == (void *)0x0) {
      __assert_fail("cfg->ttf_blob",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                    ,0x34a8,
                    "struct nk_font *nk_font_atlas_add(struct nk_font_atlas *, const struct nk_font_config *)"
                   );
    }
    nk_memcopy(dst0_00,config->ttf_blob,dst0->ttf_size);
    dst0->ttf_data_owned_by_atlas = '\x01';
  }
  atlas->font_num = atlas->font_num + 1;
  return __s;
}

Assistant:

NK_API struct nk_font*
nk_font_atlas_add(struct nk_font_atlas *atlas, const struct nk_font_config *config)
{
    struct nk_font *font = 0;
    struct nk_font_config *cfg;

    NK_ASSERT(atlas);
    NK_ASSERT(atlas->permanent.alloc);
    NK_ASSERT(atlas->permanent.free);
    NK_ASSERT(atlas->temporary.alloc);
    NK_ASSERT(atlas->temporary.free);

    NK_ASSERT(config);
    NK_ASSERT(config->ttf_blob);
    NK_ASSERT(config->ttf_size);
    NK_ASSERT(config->size > 0.0f);

    if (!atlas || !config || !config->ttf_blob || !config->ttf_size || config->size <= 0.0f||
        !atlas->permanent.alloc || !atlas->permanent.free ||
        !atlas->temporary.alloc || !atlas->temporary.free)
        return 0;

    /* allocate font config  */
    cfg = (struct nk_font_config*)
        atlas->permanent.alloc(atlas->permanent.userdata,0, sizeof(struct nk_font_config));
    NK_MEMCPY(cfg, config, sizeof(*config));
    cfg->n = cfg;
    cfg->p = cfg;

    if (!config->merge_mode) {
        /* insert font config into list */
        if (!atlas->config) {
            atlas->config = cfg;
            cfg->next = 0;
        } else {
            struct nk_font_config *i = atlas->config;
            while (i->next) i = i->next;
            i->next = cfg;
            cfg->next = 0;
        }
        /* allocate new font */
        font = (struct nk_font*)
            atlas->permanent.alloc(atlas->permanent.userdata,0, sizeof(struct nk_font));
        NK_ASSERT(font);
        nk_zero(font, sizeof(*font));
        if (!font) return 0;
        font->config = cfg;

        /* insert font into list */
        if (!atlas->fonts) {
            atlas->fonts = font;
            font->next = 0;
        } else {
            struct nk_font *i = atlas->fonts;
            while (i->next) i = i->next;
            i->next = font;
            font->next = 0;
        }
        cfg->font = &font->info;
    } else {
        /* extend previously added font */
        struct nk_font *f = 0;
        struct nk_font_config *c = 0;
        NK_ASSERT(atlas->font_num);
        f = atlas->fonts;
        c = f->config;
        cfg->font = &f->info;

        cfg->n = c;
        cfg->p = c->p;
        c->p->n = cfg;
        c->p = cfg;
    }
    /* create own copy of .TTF font blob */
    if (!config->ttf_data_owned_by_atlas) {
        cfg->ttf_blob = atlas->permanent.alloc(atlas->permanent.userdata,0, cfg->ttf_size);
        NK_ASSERT(cfg->ttf_blob);
        if (!cfg->ttf_blob) {
            atlas->font_num++;
            return 0;
        }
        NK_MEMCPY(cfg->ttf_blob, config->ttf_blob, cfg->ttf_size);
        cfg->ttf_data_owned_by_atlas = 1;
    }
    atlas->font_num++;
    return font;
}